

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring_const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,source_extend *args,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *args_2,unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_3)

{
  position_stack_node *this_00;
  function_expression *this_01;
  statement_ptr *in_R9;
  source_extend local_48;
  
  this_00 = (position_stack_node *)
            args[4].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (position_stack_node *)0x0) {
    this_01 = (function_expression *)operator_new(0x80);
    position_stack_node::extend(&local_48,this_00);
    function_expression::function_expression
              (this_01,&local_48,(source_extend *)args_1,(wstring *)args_2,
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)args_3,in_R9);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  __assert_fail("expression_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x13d,
                "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::function_expression, Args = <mjs::source_extend &, const std::basic_string<wchar_t> &, std::vector<std::basic_string<wchar_t>>, std::unique_ptr<mjs::statement>>]"
               );
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }